

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

void __thiscall
capnp::compiler::CompilerMain::readOneAndConvert
          (CompilerMain *this,BufferedInputStreamWrapper *input,OutputStream *output)

{
  RawBrandedSchema *pRVar1;
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Builder output_00;
  Reader reader_02;
  Reader reader_03;
  Builder output_01;
  Reader reader_04;
  uchar *puVar2;
  RemoveConst<unsigned_char> *pRVar3;
  uchar *puVar4;
  Disposer *pDVar5;
  bool bVar6;
  size_t sVar7;
  capnp *pcVar8;
  size_t extraout_RDX;
  capnp *pcVar9;
  Impl *pIVar10;
  ulong uVar11;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_char> input_00;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_unsigned_char> array;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  StringPtr input_01;
  ReaderOptions options;
  ReaderOptions options_00;
  ReaderOptions options_01;
  ReaderOptions options_02;
  Vector<unsigned_char> allBytes;
  Array<capnp::word> words;
  Fault f;
  Fault f_1;
  PackedInputStream unpacker;
  ArrayPtr<const_capnp::word> segments [1];
  word dummy;
  SegmentArrayMessageReader message;
  ArrayPtr<const_capnp::word> segments_1 [1];
  ParseErrorCatcher parseErrorCatcher;
  Vector<unsigned_char> local_498;
  JsonCodec local_478;
  undefined8 *local_468;
  undefined1 local_458 [16];
  WirePointer *local_448;
  int iStack_440;
  undefined4 uStack_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  PointerReader local_428;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  PackedInputStream local_3e8;
  ArrayInputStream local_3d8;
  undefined1 local_3c0 [8];
  PackedMessageReader local_3b8;
  StructReader local_278;
  StructReader local_248;
  StructReader local_218;
  StructReader local_1e8;
  ArrayPtr<const_capnp::word> local_1b8;
  ParseErrorCatcher local_1a0;
  
  ParseErrorCatcher::ParseErrorCatcher(&local_1a0,this->context);
  switch(this->convertFrom) {
  case BINARY:
    options_01._8_8_ = 0x7fffffff;
    options_01.traversalLimitInWords = 0xffffffffffffffff;
    InputStreamMessageReader::InputStreamMessageReader
              ((InputStreamMessageReader *)&local_3b8,(InputStream *)input,options_01,
               (ArrayPtr<capnp::word>)ZEXT816(0));
    MessageReader::getRootInternal((Reader *)local_458,(MessageReader *)&local_3b8);
    local_428.pointer = local_448;
    local_428.nestingLimit = iStack_440;
    local_428._28_4_ = uStack_43c;
    local_428.segment = (SegmentReader *)local_458._0_8_;
    local_428.capTable = (CapTableReader *)local_458._8_8_;
    capnp::_::PointerReader::getStruct(&local_1e8,&local_428,(word *)0x0);
    reader_00._reader.capTable = local_1e8.capTable;
    reader_00._reader.segment = local_1e8.segment;
    reader_00._reader.data = local_1e8.data;
    reader_00._reader.pointers = local_1e8.pointers;
    reader_00._reader.dataSize = local_1e8.dataSize;
    reader_00._reader.pointerCount = local_1e8.pointerCount;
    reader_00._reader._38_2_ = local_1e8._38_2_;
    reader_00._reader.nestingLimit = local_1e8.nestingLimit;
    reader_00._reader._44_4_ = local_1e8._44_4_;
    writeConversion(this,reader_00,output);
    InputStreamMessageReader::~InputStreamMessageReader((InputStreamMessageReader *)&local_3b8);
    break;
  case PACKED:
    options_02._8_8_ = 0x7fffffff;
    options_02.traversalLimitInWords = 0xffffffffffffffff;
    PackedMessageReader::PackedMessageReader
              (&local_3b8,&input->super_BufferedInputStream,options_02,
               (ArrayPtr<capnp::word>)ZEXT816(0));
    MessageReader::getRootInternal
              ((Reader *)local_458,&local_3b8.super_InputStreamMessageReader.super_MessageReader);
    local_428.pointer = local_448;
    local_428.nestingLimit = iStack_440;
    local_428._28_4_ = uStack_43c;
    local_428.segment = (SegmentReader *)local_458._0_8_;
    local_428.capTable = (CapTableReader *)local_458._8_8_;
    capnp::_::PointerReader::getStruct(&local_218,&local_428,(word *)0x0);
    reader_01._reader.capTable = local_218.capTable;
    reader_01._reader.segment = local_218.segment;
    reader_01._reader.data = local_218.data;
    reader_01._reader.pointers = local_218.pointers;
    reader_01._reader.dataSize = local_218.dataSize;
    reader_01._reader.pointerCount = local_218.pointerCount;
    reader_01._reader._38_2_ = local_218._38_2_;
    reader_01._reader.nestingLimit = local_218.nestingLimit;
    reader_01._reader._44_4_ = local_218._44_4_;
    writeConversion(this,reader_01,output);
    PackedMessageReader::~PackedMessageReader(&local_3b8);
    break;
  case FLAT:
  case CANONICAL:
    readAll(&local_498,this,input);
    uVar11 = (long)local_498.builder.pos - (long)local_498.builder.ptr;
    pIVar10 = (Impl *)(uVar11 >> 3);
    local_478.impl.disposer =
         (Disposer *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,(size_t)pIVar10,(size_t)pIVar10,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr *)0x0);
    local_468 = &kj::_::HeapArrayDisposer::instance;
    local_478.impl.ptr = pIVar10;
    memcpy(local_478.impl.disposer,local_498.builder.ptr,uVar11 & 0xfffffffffffffff8);
    local_3d8.super_BufferedInputStream.super_InputStream._vptr_InputStream =
         (InputStream)(InputStream)local_478.impl.disposer;
    local_3d8.array.ptr = &(local_478.impl.ptr)->prettyPrint;
    segments_00.size_ = 1;
    segments_00.ptr = (ArrayPtr<const_capnp::word> *)&local_3d8;
    options._8_8_ = 0x7fffffff;
    options.traversalLimitInWords = 0xffffffffffffffff;
    SegmentArrayMessageReader::SegmentArrayMessageReader
              ((SegmentArrayMessageReader *)&local_3b8,segments_00,options);
    if ((this->convertFrom == CANONICAL) &&
       (bVar6 = MessageReader::isCanonical((MessageReader *)&local_3b8), !bVar6)) {
      local_458._0_8_ = (Exception *)0x0;
      local_428.segment = (SegmentReader *)0x0;
      local_428.capTable = (CapTableReader *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)local_458,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)local_458);
    }
    MessageReader::getRootInternal((Reader *)local_458,(MessageReader *)&local_3b8);
    local_428.pointer = local_448;
    local_428.nestingLimit = iStack_440;
    local_428._28_4_ = uStack_43c;
    local_428.segment = (SegmentReader *)local_458._0_8_;
    local_428.capTable = (CapTableReader *)local_458._8_8_;
    capnp::_::PointerReader::getStruct(&local_248,&local_428,(word *)0x0);
    reader._reader.capTable = local_248.capTable;
    reader._reader.segment = local_248.segment;
    reader._reader.data = local_248.data;
    reader._reader.pointers = local_248.pointers;
    reader._reader.dataSize = local_248.dataSize;
    reader._reader.pointerCount = local_248.pointerCount;
    reader._reader._38_2_ = local_248._38_2_;
    reader._reader.nestingLimit = local_248.nestingLimit;
    reader._reader._44_4_ = local_248._44_4_;
    writeConversion(this,reader,output);
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)&local_3b8);
    pIVar10 = local_478.impl.ptr;
    pDVar5 = local_478.impl.disposer;
    if (local_478.impl.disposer != (Disposer *)0x0) {
      local_478.impl.disposer = (Disposer *)0x0;
      local_478.impl.ptr = (Impl *)0x0;
      (**(code **)*local_468)(local_468,pDVar5,8,pIVar10,pIVar10,0);
    }
    puVar4 = local_498.builder.endPtr;
    pRVar3 = local_498.builder.pos;
    puVar2 = local_498.builder.ptr;
    if ((capnp *)local_498.builder.ptr != (capnp *)0x0) {
      local_498.builder.ptr = (uchar *)0x0;
      local_498.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      local_498.builder.endPtr = (uchar *)0x0;
      (**(local_498.builder.disposer)->_vptr_ArrayDisposer)
                (local_498.builder.disposer,puVar2,1,(long)pRVar3 - (long)puVar2,
                 (long)puVar4 - (long)puVar2,0);
    }
    break;
  case FLAT_PACKED:
    readAll(&local_498,this,input);
    packedBytes.ptr = (capnp *)(local_498.builder.pos + -(long)local_498.builder.ptr);
    packedBytes.size_ = extraout_RDX;
    pIVar10 = (Impl *)computeUnpackedSizeInWords((capnp *)local_498.builder.ptr,packedBytes);
    local_478.impl.disposer =
         (Disposer *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,(size_t)pIVar10,(size_t)pIVar10,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr *)0x0);
    local_468 = &kj::_::HeapArrayDisposer::instance;
    array.size_ = (long)local_498.builder.pos - (long)local_498.builder.ptr;
    array.ptr = local_498.builder.ptr;
    local_478.impl.ptr = pIVar10;
    kj::ArrayInputStream::ArrayInputStream(&local_3d8,array);
    capnp::_::PackedInputStream::PackedInputStream(&local_3e8,&local_3d8.super_BufferedInputStream);
    kj::InputStream::read
              (&local_3e8.super_InputStream,(int)local_478.impl.disposer,
               (void *)((long)local_478.impl.ptr << 3),(size_t)((long)local_478.impl.ptr << 3));
    sVar7 = capnp::_::PackedInputStream::tryRead(&local_3e8,local_3c0,8,8);
    if (sVar7 != 0) {
      local_428.segment = (SegmentReader *)0x0;
      local_3b8.super_PackedInputStream.super_InputStream._vptr_InputStream = (_func_int **)0x0;
      local_3b8.super_PackedInputStream.inner = (BufferedInputStream *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_428,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_428);
    }
    local_1b8.ptr = (word *)local_478.impl.disposer;
    local_1b8.size_ = (size_t)local_478.impl.ptr;
    segments_01.size_ = 1;
    segments_01.ptr = &local_1b8;
    options_00._8_8_ = 0x7fffffff;
    options_00.traversalLimitInWords = 0xffffffffffffffff;
    SegmentArrayMessageReader::SegmentArrayMessageReader
              ((SegmentArrayMessageReader *)&local_3b8,segments_01,options_00);
    MessageReader::getRootInternal((Reader *)local_458,(MessageReader *)&local_3b8);
    local_428.pointer = local_448;
    local_428.nestingLimit = iStack_440;
    local_428._28_4_ = uStack_43c;
    local_428.segment = (SegmentReader *)local_458._0_8_;
    local_428.capTable = (CapTableReader *)local_458._8_8_;
    capnp::_::PointerReader::getStruct(&local_278,&local_428,(word *)0x0);
    reader_03._reader.capTable = local_278.capTable;
    reader_03._reader.segment = local_278.segment;
    reader_03._reader.data = local_278.data;
    reader_03._reader.pointers = local_278.pointers;
    reader_03._reader.dataSize = local_278.dataSize;
    reader_03._reader.pointerCount = local_278.pointerCount;
    reader_03._reader._38_2_ = local_278._38_2_;
    reader_03._reader.nestingLimit = local_278.nestingLimit;
    reader_03._reader._44_4_ = local_278._44_4_;
    writeConversion(this,reader_03,output);
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)&local_3b8);
    capnp::_::PackedInputStream::~PackedInputStream(&local_3e8);
    kj::BufferedInputStream::~BufferedInputStream(&local_3d8.super_BufferedInputStream);
    pIVar10 = local_478.impl.ptr;
    pDVar5 = local_478.impl.disposer;
    if (local_478.impl.disposer != (Disposer *)0x0) {
      local_478.impl.disposer = (Disposer *)0x0;
      local_478.impl.ptr = (Impl *)0x0;
      (**(code **)*local_468)(local_468,pDVar5,8,pIVar10,pIVar10,0);
    }
    puVar4 = local_498.builder.endPtr;
    pRVar3 = local_498.builder.pos;
    puVar2 = local_498.builder.ptr;
    if ((capnp *)local_498.builder.ptr != (capnp *)0x0) {
      local_498.builder.ptr = (uchar *)0x0;
      local_498.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      local_498.builder.endPtr = (uchar *)0x0;
      (**(local_498.builder.disposer)->_vptr_ArrayDisposer)
                (local_498.builder.disposer,puVar2,1,(long)pRVar3 - (long)puVar2,
                 (long)puVar4 - (long)puVar2,0);
    }
    break;
  case TEXT:
    readOneText((String *)&local_498,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)&local_3b8,0x400,GROW_HEURISTICALLY);
    TextCodec::TextCodec((TextCodec *)&local_478);
    TextCodec::setPrettyPrint((TextCodec *)&local_478,this->pretty);
    pRVar1 = (this->rootType).super_Schema.raw;
    MessageBuilder::getRootInternal((Builder *)&local_428,(MessageBuilder *)&local_3b8);
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
              ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)local_458,
               (EVP_PKEY_CTX *)pRVar1);
    pcVar9 = (capnp *)local_498.builder.ptr;
    if ((capnp *)local_498.builder.pos == (capnp *)0x0) {
      pcVar9 = (capnp *)0x28616d;
    }
    input_01.content.size_ =
         (capnp *)(local_498.builder.pos + ((capnp *)local_498.builder.pos == (capnp *)0x0));
    output_01.builder.segment = (SegmentBuilder *)local_458._8_8_;
    output_01.schema.super_Schema.raw = (Schema)(Schema)local_458._0_8_;
    output_01.builder.capTable = (CapTableBuilder *)local_448;
    output_01.builder.data = (void *)_iStack_440;
    output_01.builder.pointers = (WirePointer *)local_438;
    output_01.builder.dataSize = (undefined4)uStack_430;
    output_01.builder.pointerCount = uStack_430._4_2_;
    output_01.builder._38_2_ = uStack_430._6_2_;
    input_01.content.ptr = (char *)pcVar9;
    TextCodec::decode((TextCodec *)&local_478,input_01,output_01);
    capnp::_::StructBuilder::asReader((StructBuilder *)(local_458 + 8));
    local_428.segment = (SegmentReader *)local_458._0_8_;
    reader_04._reader.capTable = (CapTableReader *)local_428.pointer;
    reader_04._reader.segment = (SegmentReader *)local_428.capTable;
    reader_04._reader.data = (void *)local_428._24_8_;
    reader_04._reader.pointers = (WirePointer *)uStack_408;
    reader_04._reader.dataSize = (undefined4)local_400;
    reader_04._reader.pointerCount = local_400._4_2_;
    reader_04._reader._38_2_ = local_400._6_2_;
    reader_04._reader._40_8_ = uStack_3f8;
    writeConversion(this,reader_04,output);
    TextCodec::~TextCodec((TextCodec *)&local_478);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&local_3b8);
    pRVar3 = local_498.builder.pos;
    puVar2 = local_498.builder.ptr;
    if ((capnp *)local_498.builder.ptr != (capnp *)0x0) {
      local_498.builder.ptr = (uchar *)0x0;
      local_498.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      (*(code *)**(undefined8 **)local_498.builder.endPtr)
                (local_498.builder.endPtr,puVar2,1,pRVar3,pRVar3,0);
    }
    break;
  case JSON:
    readOneJson((String *)&local_498,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)&local_3b8,0x400,GROW_HEURISTICALLY);
    JsonCodec::JsonCodec(&local_478);
    JsonCodec::setPrettyPrint(&local_478,this->pretty);
    JsonCodec::handleByAnnotation(&local_478,(this->rootType).super_Schema.raw);
    pRVar1 = (this->rootType).super_Schema.raw;
    MessageBuilder::getRootInternal((Builder *)&local_428,(MessageBuilder *)&local_3b8);
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
              ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)local_458,
               (EVP_PKEY_CTX *)pRVar1);
    pcVar9 = (capnp *)local_498.builder.pos;
    if ((capnp *)local_498.builder.pos != (capnp *)0x0) {
      pcVar9 = (capnp *)local_498.builder.ptr;
    }
    pcVar8 = (capnp *)0x0;
    if ((capnp *)local_498.builder.pos != (capnp *)0x0) {
      pcVar8 = (capnp *)(local_498.builder.pos + -1);
    }
    output_00.builder.segment = (SegmentBuilder *)local_458._8_8_;
    output_00.schema.super_Schema.raw = (Schema)(Schema)local_458._0_8_;
    output_00.builder.capTable = (CapTableBuilder *)local_448;
    output_00.builder.data = (void *)_iStack_440;
    output_00.builder.pointers = (WirePointer *)local_438;
    output_00.builder.dataSize = (undefined4)uStack_430;
    output_00.builder.pointerCount = uStack_430._4_2_;
    output_00.builder._38_2_ = uStack_430._6_2_;
    input_00.size_ = (size_t)pcVar8;
    input_00.ptr = (char *)pcVar9;
    JsonCodec::decode(&local_478,input_00,output_00);
    capnp::_::StructBuilder::asReader((StructBuilder *)(local_458 + 8));
    local_428.segment = (SegmentReader *)local_458._0_8_;
    reader_02._reader.capTable = (CapTableReader *)local_428.pointer;
    reader_02._reader.segment = (SegmentReader *)local_428.capTable;
    reader_02._reader.data = (void *)local_428._24_8_;
    reader_02._reader.pointers = (WirePointer *)uStack_408;
    reader_02._reader.dataSize = (undefined4)local_400;
    reader_02._reader.pointerCount = local_400._4_2_;
    reader_02._reader._38_2_ = local_400._6_2_;
    reader_02._reader._40_8_ = uStack_3f8;
    writeConversion(this,reader_02,output);
    JsonCodec::~JsonCodec(&local_478);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&local_3b8);
    pRVar3 = local_498.builder.pos;
    puVar2 = local_498.builder.ptr;
    if ((capnp *)local_498.builder.ptr != (capnp *)0x0) {
      local_498.builder.ptr = (uchar *)0x0;
      local_498.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      (*(code *)**(undefined8 **)local_498.builder.endPtr)
                (local_498.builder.endPtr,puVar2,1,pRVar3,pRVar3,0);
    }
    break;
  default:
    kj::_::unreachable();
  }
  ParseErrorCatcher::~ParseErrorCatcher(&local_1a0);
  return;
}

Assistant:

void readOneAndConvert(kj::BufferedInputStreamWrapper& input, kj::OutputStream& output) {
    // Since this is a debug tool, lift the usual security limits.  Worse case is the process
    // crashes or has to be killed.
    ReaderOptions options;
    options.nestingLimit = kj::maxValue;
    options.traversalLimitInWords = kj::maxValue;

    ParseErrorCatcher parseErrorCatcher(context);

    switch (convertFrom) {
      case Format::BINARY: {
        capnp::InputStreamMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::PACKED: {
        capnp::PackedMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT:
      case Format::CANONICAL: {
        auto allBytes = readAll(input);

        // Technically we don't know if the bytes are aligned so we'd better copy them to a new
        // array. Note that if we have a non-whole number of words we chop off the straggler
        // bytes. This is fine because if those bytes are actually part of the message we will
        // hit an error later and if they are not then who cares?
        auto words = kj::heapArray<word>(allBytes.size() / sizeof(word));
        memcpy(words.begin(), allBytes.begin(), words.size() * sizeof(word));

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        if (convertFrom == Format::CANONICAL) {
          KJ_REQUIRE(message.isCanonical());
        }
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT_PACKED: {
        auto allBytes = readAll(input);

        auto words = kj::heapArray<word>(computeUnpackedSizeInWords(allBytes));
        kj::ArrayInputStream input(allBytes);
        capnp::_::PackedInputStream unpacker(input);
        unpacker.read(words.asBytes().begin(), words.asBytes().size());
        word dummy;
        KJ_ASSERT(unpacker.tryRead(&dummy, sizeof(dummy), sizeof(dummy)) == 0);

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::TEXT: {
        auto text = readOneText(input);
        MallocMessageBuilder message;
        TextCodec codec;
        codec.setPrettyPrint(pretty);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
      case Format::JSON: {
        auto text = readOneJson(input);
        MallocMessageBuilder message;
        JsonCodec codec;
        codec.setPrettyPrint(pretty);
        codec.handleByAnnotation(rootType);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
    }

    KJ_UNREACHABLE;
  }